

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderData.c
# Opt level: O2

void ZydisGetInstructionEncodingInfo(ZydisDecoderTreeNode *node,ZydisInstructionEncodingInfo **info)

{
  uint uVar1;
  
  if (-1 < (char)node->type) {
    __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                  ,0xac,
                  "void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode *, const ZydisInstructionEncodingInfo **)"
                 );
  }
  uVar1 = node->type & 0x7f;
  if ((byte)uVar1 < 0x14) {
    *info = INSTR_ENCODINGS + uVar1;
    return;
  }
  __assert_fail("class < (sizeof(INSTR_ENCODINGS) / sizeof((INSTR_ENCODINGS)[0]))",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                ,0xae,
                "void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode *, const ZydisInstructionEncodingInfo **)"
               );
}

Assistant:

void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode* node,
    const ZydisInstructionEncodingInfo** info)
{
    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
    const ZyanU8 class = (node->type) & 0x7F;
    ZYAN_ASSERT(class < ZYAN_ARRAY_LENGTH(INSTR_ENCODINGS));
    *info = &INSTR_ENCODINGS[class];
}